

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

int Gia_ManSimPatHashPatterns(Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int *pnC0,int *pnC1)

{
  ulong uVar1;
  size_t __n;
  int iVar2;
  word *pwVar3;
  uint uVar4;
  uint uVar5;
  Vec_Mem_t *p_00;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *p_01;
  word **ppwVar8;
  word *pwVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  
  p_00 = (Vec_Mem_t *)calloc(1,0x30);
  p_00->nEntrySize = nWords;
  p_00->LogPageSze = 0xc;
  p_00->PageMask = 0xfff;
  p_00->iPage = -1;
  if ((p_00->vTable != (Vec_Int_t *)0x0) || (p_00->vNexts != (Vec_Int_t *)0x0)) {
    __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
  }
  uVar17 = 0xfff;
  while( true ) {
    do {
      uVar12 = uVar17;
      uVar17 = uVar12 + 1;
    } while ((uVar12 & 1) != 0);
    if (uVar17 < 9) break;
    iVar10 = 5;
    while (uVar17 % (iVar10 - 2U) != 0) {
      uVar4 = iVar10 * iVar10;
      iVar10 = iVar10 + 2;
      if (uVar17 < uVar4) goto LAB_007c83c7;
    }
  }
LAB_007c83c7:
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar12) {
    uVar4 = uVar17;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar4;
  piVar7 = (int *)malloc((long)(int)uVar4 << 2);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar17;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,(long)(int)uVar17 << 2);
  }
  p_00->vTable = pVVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 0x1000;
  p_01->nSize = 0;
  piVar7 = (int *)malloc(0x4000);
  p_01->pArray = piVar7;
  p_00->vNexts = p_01;
  if (0 < p->nObjs) {
    __n = (long)nWords * 8;
    lVar14 = 0;
    lVar18 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar17 = *(uint *)(p->pObjs + lVar18);
      uVar12 = ~uVar17;
      if (((uVar12 & 0x9fffffff) == 0) || (-1 < (int)uVar17 && (uVar12 & 0x1fffffff) != 0)) {
        lVar15 = lVar18 * nWords;
        if ((lVar15 < 0) || (vSims->nSize <= lVar15)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar3 = vSims->pArray;
        if (pnC0 != (int *)0x0) {
          if (0 < nWords) {
            uVar11 = 0;
            do {
              if (*(long *)((long)pwVar3 + uVar11 * 8 + lVar14) != 0) goto LAB_007c8527;
              uVar11 = uVar11 + 1;
            } while ((uint)nWords != uVar11);
          }
          *pnC0 = *pnC0 + 1;
        }
LAB_007c8527:
        if (pnC1 != (int *)0x0) {
          if (0 < nWords) {
            uVar11 = 0;
            do {
              if (*(long *)((long)pwVar3 + uVar11 * 8 + lVar14) != -1) goto LAB_007c8552;
              uVar11 = uVar11 + 1;
            } while ((uint)nWords != uVar11);
          }
          *pnC1 = *pnC1 + 1;
        }
LAB_007c8552:
        uVar17 = p_00->nEntries;
        if (pVVar6->nSize < (int)uVar17) {
          uVar11 = (ulong)(pVVar6->nSize * 2 - 1);
          while( true ) {
            do {
              uVar12 = (uint)uVar11;
              uVar4 = uVar12 + 1;
              uVar16 = (ulong)uVar4;
              uVar1 = uVar11 & 1;
              uVar11 = uVar16;
            } while (uVar1 != 0);
            if (uVar4 < 9) break;
            iVar10 = 5;
            while( true ) {
              if (uVar4 % (iVar10 - 2U) == 0) break;
              uVar5 = iVar10 * iVar10;
              iVar10 = iVar10 + 2;
              if (uVar4 < uVar5) goto LAB_007c85aa;
            }
          }
LAB_007c85aa:
          if (pVVar6->nCap < (int)uVar4) {
            if (pVVar6->pArray == (int *)0x0) {
              piVar7 = (int *)malloc((long)(int)uVar4 << 2);
            }
            else {
              piVar7 = (int *)realloc(pVVar6->pArray,(long)(int)uVar4 << 2);
            }
            pVVar6->pArray = piVar7;
            if (piVar7 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar6->nCap = uVar4;
          }
          if (uVar12 < 0x7fffffff) {
            memset(pVVar6->pArray,0xff,uVar16 << 2);
          }
          pVVar6->nSize = uVar4;
          p_01->nSize = 0;
          if (0 < (int)uVar17) {
            ppwVar8 = p_00->ppPages;
            pwVar9 = *ppwVar8;
            if (pwVar9 != (word *)0x0) {
              uVar12 = 1;
              do {
                piVar7 = Vec_MemHashLookup(p_00,pwVar9 + (int)((uVar12 - 1 & 0xfff) * nWords));
                if (*piVar7 != -1) {
                  __assert_fail("*pSpot == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                                ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
                }
                *piVar7 = p_01->nSize;
                Vec_IntPush(p_01,-1);
                if (uVar17 == uVar12) break;
                pwVar9 = ppwVar8[uVar12 >> 0xc];
                uVar12 = uVar12 + 1;
              } while (pwVar9 != (word *)0x0);
            }
          }
          if (uVar17 != p_01->nSize) {
            __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
          }
        }
        piVar7 = Vec_MemHashLookup(p_00,pwVar3 + lVar15);
        if (*piVar7 == -1) {
          *piVar7 = p_01->nSize;
          Vec_IntPush(p_01,-1);
          if ((int)uVar17 < 0) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
          }
          uVar12 = uVar17 >> 0xc;
          iVar10 = p_00->iPage;
          if (iVar10 < (int)uVar12) {
            iVar2 = p_00->nPageAlloc;
            if (iVar2 <= (int)uVar12) {
              iVar13 = uVar12 + 0x20;
              if (iVar2 != 0) {
                iVar13 = iVar2 * 2;
              }
              p_00->nPageAlloc = iVar13;
              if (p_00->ppPages == (word **)0x0) {
                ppwVar8 = (word **)malloc((long)iVar13 * 8);
              }
              else {
                ppwVar8 = (word **)realloc(p_00->ppPages,(long)iVar13 * 8);
              }
              p_00->ppPages = ppwVar8;
            }
            ppwVar8 = p_00->ppPages;
            uVar11 = (long)iVar10;
            do {
              uVar1 = uVar11 + 1;
              pwVar9 = (word *)malloc((long)(nWords << 0xc) << 3);
              ppwVar8[uVar11 + 1] = pwVar9;
              uVar11 = uVar1;
            } while (uVar12 != uVar1);
            p_00->iPage = uVar12;
          }
          p_00->nEntries = uVar17 + 1;
          memmove(p_00->ppPages[uVar12] + (int)((uVar17 & 0xfff) * nWords),pwVar3 + lVar15,__n);
          if (uVar17 + 1 != p_01->nSize) {
            __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
          }
        }
      }
      lVar18 = lVar18 + 1;
      lVar14 = lVar14 + __n;
    } while (lVar18 < p->nObjs);
  }
  iVar10 = p_00->nEntries;
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  p_00->vTable = (Vec_Int_t *)0x0;
  pVVar6 = p_00->vNexts;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (int *)0x0;
    }
    free(pVVar6);
    p_00->vNexts = (Vec_Int_t *)0x0;
  }
  uVar17 = p_00->iPage;
  if (-1 < (int)uVar17) {
    ppwVar8 = p_00->ppPages;
    lVar14 = 0;
    do {
      pwVar3 = ppwVar8[lVar14];
      if (pwVar3 != (word *)0x0) {
        free(pwVar3);
        ppwVar8[lVar14] = (word *)0x0;
      }
      lVar14 = lVar14 + 1;
    } while ((ulong)uVar17 + 1 != lVar14);
  }
  if (p_00->ppPages != (word **)0x0) {
    free(p_00->ppPages);
    p_00->ppPages = (word **)0x0;
  }
  free(p_00);
  return iVar10;
}

Assistant:

int Gia_ManSimPatHashPatterns( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int * pnC0, int * pnC1 )
{
    Gia_Obj_t * pObj; 
    int i, nUnique;
    Vec_Mem_t * vStore;
    vStore = Vec_MemAlloc( nWords, 12 ); // 2^12 N-word entries per page
    Vec_MemHashAlloc( vStore, 1 << 12 );
    Gia_ManForEachCand( p, pObj, i )
    {
        word * pSim = Vec_WrdEntryP(vSims, i*nWords);
        if ( pnC0 && Abc_TtIsConst0(pSim, nWords) )
            (*pnC0)++;
        if ( pnC1 && Abc_TtIsConst1(pSim, nWords) )
            (*pnC1)++;
        Vec_MemHashInsert( vStore, pSim );
    }
    nUnique = Vec_MemEntryNum( vStore );
    Vec_MemHashFree( vStore );
    Vec_MemFree( vStore );
    return nUnique;
}